

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O0

void qpCrashHandler_destroy(qpCrashHandler *handler)

{
  int local_14;
  int sigNdx;
  qpCrashHandler *handler_local;
  
  deSetAssertFailureCallback((deAssertFailureCallbackFunc)0x0);
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    sigaction(s_signals[local_14].signalNum,(sigaction *)(handler->oldHandlers + local_14),
              (sigaction *)0x0);
  }
  g_crashHandler = (qpCrashHandler *)0x0;
  deFree(handler);
  return;
}

Assistant:

void qpCrashHandler_destroy (qpCrashHandler* handler)
{
	DBGPRINT(("qpCrashHandler::destroy()\n"));

	DE_ASSERT(g_crashHandler == handler);

	deSetAssertFailureCallback(DE_NULL);

#if defined(QP_USE_SIGNAL_HANDLER)
	/* Restore old handlers. */
	{
		int sigNdx;
		for (sigNdx = 0; sigNdx < DE_LENGTH_OF_ARRAY(s_signals); sigNdx++)
			sigaction(s_signals[sigNdx].signalNum, &handler->oldHandlers[sigNdx], DE_NULL);
	}
#endif

	g_crashHandler = DE_NULL;

	deFree(handler);
}